

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O1

string * __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::StructConstructorParams
          (string *__return_storage_ptr__,KotlinKMPGenerator *this,StructDef *struct_def,
          string *prefix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FieldDef *pFVar2;
  StructDef *struct_def_00;
  string *psVar3;
  long *plVar4;
  ostream *poVar5;
  long *plVar6;
  size_type *psVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  pointer ppFVar10;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> field_vec;
  stringstream out;
  string local_270;
  string local_250;
  KotlinKMPGenerator *local_230;
  IdlNamer *local_228;
  string *local_220;
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> local_1f8;
  string *local_1e0;
  size_type *local_1d8 [2];
  size_type local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_230 = this;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            (&local_1f8,&(struct_def->fields).vec);
  local_220 = prefix;
  if (prefix->_M_string_length == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"builder: FlatBufferBuilder",0x1a);
  }
  local_1e0 = __return_storage_ptr__;
  if (local_1f8.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1f8.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_228 = &local_230->namer_;
    paVar1 = &local_250.field_2;
    ppFVar10 = local_1f8.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      pFVar2 = *ppFVar10;
      if (((pFVar2->value).type.base_type == BASE_TYPE_STRUCT) &&
         (((pFVar2->value).type.struct_def)->fixed == true)) {
        struct_def_00 = (pFVar2->value).type.struct_def;
        (*(local_228->super_Namer)._vptr_Namer[7])(local_1d8,local_228,pFVar2);
        plVar4 = (long *)std::__cxx11::string::append((char *)local_1d8);
        local_218 = &local_208;
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_208 = *plVar6;
          lStack_200 = plVar4[3];
        }
        else {
          local_208 = *plVar6;
          local_218 = (long *)*plVar4;
        }
        local_210 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_218,0,(char *)0x0,
                                    (ulong)(local_220->_M_dataplus)._M_p);
        psVar7 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_250.field_2._M_allocated_capacity = *psVar7;
          local_250.field_2._8_8_ = plVar4[3];
          local_250._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_250.field_2._M_allocated_capacity = *psVar7;
          local_250._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_250._M_string_length = plVar4[1];
        *plVar4 = (long)psVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        StructConstructorParams(&local_270,local_230,struct_def_00,&local_250);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != paVar1) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if (local_218 != &local_208) {
          operator_delete(local_218,local_208 + 1);
        }
        uVar8 = local_1c8[0];
        _Var9._M_p = (pointer)local_1d8[0];
        if (local_1d8[0] != local_1c8) {
LAB_002014cf:
          operator_delete(_Var9._M_p,uVar8 + 1);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,(local_220->_M_dataplus)._M_p,local_220->_M_string_length);
        (*(local_228->super_Namer)._vptr_Namer[7])(&local_270,local_228,pFVar2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_270._M_dataplus._M_p,local_270._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
        GenType_abi_cxx11_(&local_250,local_230,&(pFVar2->value).type);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_250._M_dataplus._M_p,local_250._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != paVar1) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        uVar8 = local_270.field_2._M_allocated_capacity;
        _Var9._M_p = local_270._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) goto LAB_002014cf;
      }
      ppFVar10 = ppFVar10 + 1;
    } while (ppFVar10 !=
             local_1f8.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  psVar3 = local_1e0;
  std::__cxx11::stringbuf::str();
  if (local_1f8.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.
                    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string StructConstructorParams(const StructDef &struct_def,
                                      const std::string &prefix = "") const {
    // builder: FlatBufferBuilder
    std::stringstream out;
    auto field_vec = struct_def.fields.vec;
    if (prefix.empty()) { out << "builder: FlatBufferBuilder"; }
    for (auto it = field_vec.begin(); it != field_vec.end(); ++it) {
      auto &field = **it;
      if (IsStruct(field.value.type)) {
        // Generate arguments for a struct inside a struct. To ensure
        // names don't clash, and to make it obvious these arguments are
        // constructing a nested struct, prefix the name with the field
        // name.
        out << StructConstructorParams(*field.value.type.struct_def,
                                       prefix + (namer_.Variable(field) + "_"));
      } else {
        out << ", " << prefix << namer_.Variable(field) << ": "
            << GenType(field.value.type);
      }
    }
    return out.str();
  }